

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  undefined1 auVar5 [12];
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiContext *g;
  uint uVar8;
  bool is_logarithmic;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float logarithmic_zero_epsilon;
  undefined1 auVar16 [16];
  float fVar12;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar13;
  float fVar14;
  undefined1 in_register_00001204 [60];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  float zero_deadzone_halfsize;
  float old_clicked_t;
  float fVar15;
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  auVar25._4_60_ = in_register_00001244;
  auVar25._0_4_ = v_max;
  auVar20._4_60_ = in_register_00001204;
  auVar20._0_4_ = v_min;
  uVar8 = flags & 0x100000;
  uVar10 = data_type & 0xfffffffe;
  is_logarithmic = (bool)((byte)((flags & 0x20U) >> 5) & uVar10 == 8);
  fVar1 = *(float *)((long)&(bb->Min).x + (ulong)(uVar8 >> 0x12));
  fVar2 = *(float *)((long)&(bb->Max).x + (ulong)(uVar8 >> 0x12));
  fVar4 = (fVar2 - fVar1) + -4.0;
  fVar12 = (GImGui->Style).GrabMinSize;
  auVar17 = ZEXT416((uint)fVar12);
  auVar16 = vcmpss_avx(auVar20._0_16_,auVar25._0_16_,1);
  auVar16 = vblendvps_avx(ZEXT416((uint)(v_min - v_max)),ZEXT416((uint)(v_max - v_min)),auVar16);
  fVar15 = auVar16._0_4_;
  if ((uVar10 != 8) && (0.0 <= fVar15)) {
    auVar23 = ZEXT416((uint)(fVar4 / (fVar15 + 1.0)));
    auVar17 = vcmpss_avx(ZEXT416((uint)fVar12),auVar23,2);
    auVar17 = vblendvps_avx(ZEXT416((uint)fVar12),auVar23,auVar17);
  }
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)fVar4));
  fVar11 = auVar17._0_4_;
  fVar12 = fVar4 - fVar11;
  zero_deadzone_halfsize = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if (is_logarithmic != false) {
    iVar7 = ImParseFormatPrecision(format,3);
    logarithmic_zero_epsilon = powf(0.1,(float)iVar7);
    auVar17 = vmaxss_avx(ZEXT416((uint)fVar12),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar6->Style).LogSliderDeadzone * 0.5) / auVar17._0_4_;
  }
  fVar1 = fVar11 * 0.5 + fVar1 + 2.0;
  if (pIVar6->ActiveId == id) {
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar6->ActiveIdIsJustActivated == true) {
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
      auVar21._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar21._8_56_ = extraout_var;
      auVar17 = auVar21._0_16_;
      if (uVar8 != 0) {
        auVar23 = vmovshdup_avx(auVar17);
        auVar17._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
        auVar17._8_4_ = auVar23._8_4_ ^ 0x80000000;
        auVar17._12_4_ = auVar23._12_4_ ^ 0x80000000;
      }
      fVar12 = auVar17._0_4_;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        auVar5 = auVar17._4_12_;
        if ((uVar10 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
          auVar18._0_4_ = fVar12 / 100.0;
          auVar18._4_12_ = auVar5;
          auVar22._0_4_ = auVar18._0_4_ / 10.0;
          auVar22._4_12_ = auVar5;
          auVar16 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          auVar19 = vblendvps_avx(auVar18,auVar22,auVar16);
        }
        else {
          auVar23._8_4_ = 0x7fffffff;
          auVar23._0_8_ = 0x7fffffff7fffffff;
          auVar23._12_4_ = 0x7fffffff;
          auVar16 = vandps_avx(auVar23,auVar16);
          if ((auVar16._0_4_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            auVar16 = vcmpss_avx(auVar17,ZEXT816(0) << 0x40,1);
            auVar24._8_4_ = 0xbf800000;
            auVar24._0_8_ = 0xbf800000bf800000;
            auVar24._12_4_ = 0xbf800000;
            auVar26._8_4_ = 0x3f800000;
            auVar26._0_8_ = 0x3f8000003f800000;
            auVar26._12_4_ = 0x3f800000;
            auVar16 = vblendvps_avx(auVar26,auVar24,auVar16);
            auVar19._0_4_ = auVar16._0_4_ / fVar15;
            auVar19._4_12_ = auVar16._4_12_;
          }
          else {
            auVar19._0_4_ = fVar12 / 100.0;
            auVar19._4_12_ = auVar5;
          }
        }
        auVar16 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        auVar16 = vblendvps_avx(auVar19,ZEXT416((uint)(auVar19._0_4_ * 10.0)),auVar16);
        fVar12 = auVar16._0_4_ + pIVar6->SliderCurrentAccum;
        pIVar6->SliderCurrentAccum = fVar12;
        pIVar6->SliderCurrentAccumDirty = true;
      }
      else {
        fVar12 = pIVar6->SliderCurrentAccum;
      }
      if ((pIVar6->NavActivatePressedId == id) && (pIVar6->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar6->SliderCurrentAccumDirty == true) {
        fVar13 = ScaleRatioFromValueT<float,float,float>
                           (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            zero_deadzone_halfsize);
        if (((fVar13 < 1.0) || (fVar12 <= 0.0)) && ((0.0 < fVar13 || (0.0 <= fVar12)))) {
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar12 + fVar13)));
          auVar16 = vcmpss_avx(ZEXT416((uint)(fVar12 + fVar13)),ZEXT816(0) << 0x40,1);
          auVar16 = vandnps_avx(auVar16,auVar17);
          fVar15 = auVar16._0_4_;
          fVar14 = ScaleValueFromRatioT<float,float,float>
                             (data_type,fVar15,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                              zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            fVar14 = RoundScalarWithFormatT<float,float>(format,data_type,fVar14);
          }
          fVar14 = ScaleRatioFromValueT<float,float,float>
                             (data_type,fVar14,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                              zero_deadzone_halfsize);
          fVar14 = fVar14 - fVar13;
          bVar9 = fVar12 <= fVar14;
          if (0.0 < fVar12) {
            bVar9 = fVar14 < fVar12;
          }
          if (!bVar9) {
            fVar14 = fVar12;
          }
          pIVar6->SliderCurrentAccum = pIVar6->SliderCurrentAccum - fVar14;
          pIVar6->SliderCurrentAccumDirty = false;
          goto LAB_00181497;
        }
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
      bVar9 = false;
      goto LAB_00181628;
    }
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar6->IO).MouseDown[0] == false) {
        ClearActiveID();
      }
      else {
        fVar15 = 0.0;
        if (0.0 < fVar12) {
          auVar16._0_4_ =
               (*(float *)((pIVar6->IO).MouseDown + (ulong)(uVar8 >> 0x14) * 4 + -8) - fVar1) /
               fVar12;
          auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          auVar16 = vcmpss_avx(auVar16,ZEXT816(0) << 0x20,1);
          auVar16 = vandnps_avx(auVar16,auVar17);
          fVar15 = auVar16._0_4_;
        }
        if (uVar8 != 0) {
          fVar15 = 1.0 - fVar15;
        }
LAB_00181497:
        fVar12 = ScaleValueFromRatioT<float,float,float>
                           (data_type,fVar15,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          fVar12 = RoundScalarWithFormatT<float,float>(format,data_type,fVar12);
        }
        if ((*v != fVar12) || (NAN(*v) || NAN(fVar12))) {
          *v = fVar12;
          bVar9 = true;
          goto LAB_00181628;
        }
      }
    }
  }
  bVar9 = false;
LAB_00181628:
  if (1.0 <= fVar4) {
    fVar12 = ScaleRatioFromValueT<float,float,float>
                       (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                        zero_deadzone_halfsize);
    if (uVar8 != 0) {
      fVar12 = 1.0 - fVar12;
    }
    fVar1 = (((fVar2 + -2.0) - fVar11 * 0.5) - fVar1) * fVar12 + fVar1;
    if (uVar8 != 0) {
      fVar2 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar11 * 0.5 + fVar1;
      (out_grab_bb->Max).x = fVar2 + -2.0;
      (out_grab_bb->Max).y = fVar11 * 0.5 + fVar1;
    }
    else {
      fVar2 = (bb->Min).y;
      fVar12 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar11 * 0.5 + fVar1;
      (out_grab_bb->Min).y = fVar2 + 2.0;
      (out_grab_bb->Max).x = fVar11 * 0.5 + fVar1;
      (out_grab_bb->Max).y = fVar12 + -2.0;
    }
  }
  else {
    IVar3 = bb->Min;
    out_grab_bb->Min = IVar3;
    out_grab_bb->Max = IVar3;
  }
  return bVar9;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}